

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O0

xmlTextReaderPtr xmlReaderWalker(xmlDocPtr doc)

{
  xmlGenericErrorFunc p_Var1;
  xmlGenericErrorFunc *pp_Var2;
  void **ppvVar3;
  xmlDictPtr pxVar4;
  xmlTextReaderPtr ret;
  xmlDocPtr doc_local;
  
  if (doc == (xmlDocPtr)0x0) {
    doc_local = (xmlDocPtr)0x0;
  }
  else {
    doc_local = (xmlDocPtr)(*xmlMalloc)(0x150);
    if (doc_local == (xmlDocPtr)0x0) {
      pp_Var2 = __xmlGenericError();
      p_Var1 = *pp_Var2;
      ppvVar3 = __xmlGenericErrorContext();
      (*p_Var1)(*ppvVar3,"xmlNewTextReader : malloc failed\n");
      doc_local = (xmlDocPtr)0x0;
    }
    else {
      memset(doc_local,0,0x150);
      *(undefined4 *)&doc_local[1]._private = 0;
      doc_local->next = (_xmlNode *)0x0;
      *(undefined4 *)&doc_local->_private = 0;
      doc_local->encoding = (xmlChar *)0x0;
      doc_local->ids = (void *)0x0;
      *(undefined4 *)&doc_local->version = 0;
      *(undefined4 *)((long)&doc_local->version + 4) = 0;
      *(undefined4 *)((long)&doc_local->name + 4) = 2;
      *(xmlDocPtr *)&doc_local->type = doc;
      *(undefined4 *)&doc_local->children = 0;
      pxVar4 = xmlDictCreate();
      doc_local->psvi = pxVar4;
    }
  }
  return (xmlTextReaderPtr)doc_local;
}

Assistant:

xmlTextReaderPtr
xmlReaderWalker(xmlDocPtr doc)
{
    xmlTextReaderPtr ret;

    if (doc == NULL)
        return(NULL);

    ret = xmlMalloc(sizeof(xmlTextReader));
    if (ret == NULL) {
        xmlGenericError(xmlGenericErrorContext,
		"xmlNewTextReader : malloc failed\n");
	return(NULL);
    }
    memset(ret, 0, sizeof(xmlTextReader));
    ret->entNr = 0;
    ret->input = NULL;
    ret->mode = XML_TEXTREADER_MODE_INITIAL;
    ret->node = NULL;
    ret->curnode = NULL;
    ret->base = 0;
    ret->cur = 0;
    ret->allocs = XML_TEXTREADER_CTXT;
    ret->doc = doc;
    ret->state = XML_TEXTREADER_START;
    ret->dict = xmlDictCreate();
    return(ret);
}